

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O2

void jsonnet_destroy(JsonnetVm *vm)

{
  if (vm != (JsonnetVm *)0x0) {
    JsonnetVm::~JsonnetVm(vm);
  }
  operator_delete(vm,0xf0);
  return;
}

Assistant:

void jsonnet_destroy(JsonnetVm *vm)
{
    TRY
        delete vm;
    CATCH("jsonnet_destroy")
}